

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

FrameOpResult __thiscall
QRhiGles2::beginOffscreenFrame(QRhiGles2 *this,QRhiCommandBuffer **cb,BeginFrameFlags param_2)

{
  QGles2CommandBuffer *this_00;
  GLuint GVar1;
  bool bVar2;
  FrameOpResult FVar3;
  Command *pCVar4;
  
  bVar2 = ensureContext(this,(QSurface *)0x0);
  if (bVar2) {
    (this->ofr).active = true;
    executeDeferredReleases(this);
    this_00 = &(this->ofr).cbWrapper;
    QGles2CommandBuffer::resetState(this_00);
    if (((((this->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.super_QFlagsStorage<QRhi::Flag>
           .i & 8) != 0) && (((this->caps).field_0x3c & 0x40) != 0)) &&
       ((this->ofr).tsQueries[0] == 0)) {
      (*(this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions[7])
                (2,(this->ofr).tsQueries);
    }
    GVar1 = (this->ofr).tsQueries[0];
    pCVar4 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                       (&(this->ofr).cbWrapper.commands);
    pCVar4->cmd = BeginFrame;
    (pCVar4->args).beginFrame.timestampQuery = GVar1;
    *cb = &this_00->super_QRhiCommandBuffer;
    FVar3 = FrameOpSuccess;
  }
  else {
    FVar3 = (uint)this->contextLost * 2 + FrameOpError;
  }
  return FVar3;
}

Assistant:

QRhi::FrameOpResult QRhiGles2::beginOffscreenFrame(QRhiCommandBuffer **cb, QRhi::BeginFrameFlags)
{
    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    ofr.active = true;

    executeDeferredReleases();
    ofr.cbWrapper.resetState();

    if (rhiFlags.testFlag(QRhi::EnableTimestamps) && caps.timestamps) {
        if (!ofr.tsQueries[0])
            f->glGenQueries(2, ofr.tsQueries);
    }

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::BeginFrame, ofr.tsQueries[0]);
    *cb = &ofr.cbWrapper;

    return QRhi::FrameOpSuccess;
}